

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O0

void display_panel(panel *p,_Bool left_adj,region *bounds)

{
  wchar_t x;
  int iVar1;
  size_t sVar2;
  panel_line *ppVar3;
  wchar_t local_64;
  int local_58;
  panel_line *pl_1;
  wchar_t len_1;
  wchar_t len;
  panel_line *pl;
  wchar_t offset;
  wchar_t w;
  wchar_t row;
  wchar_t col;
  size_t i;
  region *bounds_local;
  _Bool left_adj_local;
  panel *p_local;
  
  x = bounds->col;
  offset = bounds->row;
  iVar1 = bounds->width;
  pl._0_4_ = 0;
  region_erase(bounds);
  if (left_adj) {
    for (_row = 0; _row < p->len; _row = _row + 1) {
      if (p->lines[_row].label == (char *)0x0) {
        local_58 = 0;
      }
      else {
        sVar2 = strlen(p->lines[_row].label);
        local_58 = (int)sVar2;
      }
      if ((int)pl < local_58) {
        pl._0_4_ = local_58;
      }
    }
    pl._0_4_ = (int)pl + 2;
  }
  for (_row = 0; _row < p->len; _row = _row + 1) {
    ppVar3 = p->lines + _row;
    if (ppVar3->label != (char *)0x0) {
      sVar2 = strlen(ppVar3->label);
      Term_putstr(x,offset,(wchar_t)sVar2,L'\x01',ppVar3->label);
      sVar2 = strlen(ppVar3->value);
      local_64 = (wchar_t)sVar2;
      if (iVar1 - (int)pl <= local_64) {
        local_64 = (iVar1 - (int)pl) + L'\xffffffff';
      }
      if (left_adj) {
        Term_putstr(x + (int)pl,offset,local_64,(uint)ppVar3->attr,ppVar3->value);
      }
      else {
        Term_putstr((x + iVar1) - local_64,offset,local_64,(uint)ppVar3->attr,ppVar3->value);
      }
    }
    offset = offset + L'\x01';
  }
  return;
}

Assistant:

static void display_panel(const struct panel *p, bool left_adj,
		const region *bounds)
{
	size_t i;
	int col = bounds->col;
	int row = bounds->row;
	int w = bounds->width;
	int offset = 0;

	region_erase(bounds);

	if (left_adj) {
		for (i = 0; i < p->len; i++) {
			struct panel_line *pl = &p->lines[i];

			int len = pl->label ? strlen(pl->label) : 0;
			if (offset < len) offset = len;
		}
		offset += 2;
	}

	for (i = 0; i < p->len; i++, row++) {
		int len;
		struct panel_line *pl = &p->lines[i];

		if (!pl->label)
			continue;

		Term_putstr(col, row, strlen(pl->label), COLOUR_WHITE, pl->label);

		len = strlen(pl->value);
		len = len < w - offset ? len : w - offset - 1;

		if (left_adj)
			Term_putstr(col+offset, row, len, pl->attr, pl->value);
		else
			Term_putstr(col+w-len, row, len, pl->attr, pl->value);
	}
}